

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rebuildPage(CellArray *pCArray,int iFirst,int nCell,MemPage *pPg)

{
  ushort uVar1;
  uint uVar2;
  u8 *puVar3;
  uint uVar4;
  int iVar5;
  u8 *puVar6;
  void *pvVar7;
  u8 *puStack_88;
  u16 sz;
  u8 *pCell;
  u8 *pSrcEnd;
  u8 *puStack_70;
  int k;
  u8 *pData;
  u8 *pTmp;
  u8 *pCellptr;
  uint local_50;
  int iEnd;
  u32 j;
  int i;
  u8 *pEnd;
  int usableSize;
  u8 *aData;
  int hdr;
  MemPage *pPg_local;
  int nCell_local;
  int iFirst_local;
  CellArray *pCArray_local;
  
  uVar4 = (uint)pPg->hdrOffset;
  puVar3 = pPg->aData;
  uVar2 = pPg->pBt->usableSize;
  puVar6 = puVar3 + (int)uVar2;
  pTmp = pPg->aCellIdx;
  pvVar7 = sqlite3PagerTempSpace(pPg->pBt->pPager);
  local_50 = (uint)CONCAT11(puVar3[(int)(uVar4 + 5)],puVar3[(long)(int)(uVar4 + 5) + 1]);
  if (uVar2 < local_50) {
    local_50 = 0;
  }
  memcpy((void *)((long)pvVar7 + (ulong)local_50),puVar3 + local_50,(ulong)(uVar2 - local_50));
  for (pSrcEnd._4_4_ = 0; pCArray->ixNx[pSrcEnd._4_4_] <= iFirst && pSrcEnd._4_4_ < 6;
      pSrcEnd._4_4_ = pSrcEnd._4_4_ + 1) {
  }
  pCell = pCArray->apEnd[pSrcEnd._4_4_];
  puStack_70 = puVar6;
  iEnd = iFirst;
  while( true ) {
    puStack_88 = pCArray->apCell[iEnd];
    uVar1 = pCArray->szCell[iEnd];
    if ((puStack_88 < puVar3) || (puVar6 <= puStack_88)) {
      if ((pCell < puStack_88 + (int)(uint)uVar1) && (puStack_88 < pCell)) {
        iVar5 = sqlite3CorruptError(0x111d3);
        return iVar5;
      }
    }
    else {
      if (puVar6 < puStack_88 + (int)(uint)uVar1) {
        iVar5 = sqlite3CorruptError(0x111ce);
        return iVar5;
      }
      puStack_88 = (u8 *)((long)pvVar7 + ((long)puStack_88 - (long)puVar3));
    }
    puStack_70 = puStack_70 + -(long)(int)(uint)uVar1;
    *pTmp = (u8)((ulong)((long)puStack_70 - (long)puVar3) >> 8);
    pTmp[1] = (char)puStack_70 - (char)puVar3;
    pTmp = pTmp + 2;
    if (puStack_70 < pTmp) {
      iVar5 = sqlite3CorruptError(0x111d9);
      return iVar5;
    }
    memcpy(puStack_70,puStack_88,(ulong)uVar1);
    iEnd = iEnd + 1;
    if (iFirst + nCell <= iEnd) break;
    if (pCArray->ixNx[pSrcEnd._4_4_] <= iEnd) {
      pSrcEnd._4_4_ = pSrcEnd._4_4_ + 1;
      pCell = pCArray->apEnd[pSrcEnd._4_4_];
    }
  }
  pPg->nCell = (u16)nCell;
  pPg->nOverflow = '\0';
  puVar3[(int)(uVar4 + 1)] = '\0';
  puVar3[(long)(int)(uVar4 + 1) + 1] = '\0';
  puVar3[(int)(uVar4 + 3)] = (u8)(pPg->nCell >> 8);
  puVar3[(long)(int)(uVar4 + 3) + 1] = (u8)pPg->nCell;
  puVar3[(int)(uVar4 + 5)] = (u8)((ulong)((long)puStack_70 - (long)puVar3) >> 8);
  puVar3[(long)(int)(uVar4 + 5) + 1] = (char)puStack_70 - (char)puVar3;
  puVar3[(int)(uVar4 + 7)] = '\0';
  return 0;
}

Assistant:

static int rebuildPage(
  CellArray *pCArray,             /* Content to be added to page pPg */
  int iFirst,                     /* First cell in pCArray to use */
  int nCell,                      /* Final number of cells on page */
  MemPage *pPg                    /* The page to be reconstructed */
){
  const int hdr = pPg->hdrOffset;          /* Offset of header on pPg */
  u8 * const aData = pPg->aData;           /* Pointer to data for pPg */
  const int usableSize = pPg->pBt->usableSize;
  u8 * const pEnd = &aData[usableSize];
  int i = iFirst;                 /* Which cell to copy from pCArray*/
  u32 j;                          /* Start of cell content area */
  int iEnd = i+nCell;             /* Loop terminator */
  u8 *pCellptr = pPg->aCellIdx;
  u8 *pTmp = sqlite3PagerTempSpace(pPg->pBt->pPager);
  u8 *pData;
  int k;                          /* Current slot in pCArray->apEnd[] */
  u8 *pSrcEnd;                    /* Current pCArray->apEnd[k] value */

  assert( i<iEnd );
  j = get2byte(&aData[hdr+5]);
  if( NEVER(j>(u32)usableSize) ){ j = 0; }
  memcpy(&pTmp[j], &aData[j], usableSize - j);

  for(k=0; pCArray->ixNx[k]<=i && ALWAYS(k<NB*2); k++){}
  pSrcEnd = pCArray->apEnd[k];

  pData = pEnd;
  while( 1/*exit by break*/ ){
    u8 *pCell = pCArray->apCell[i];
    u16 sz = pCArray->szCell[i];
    assert( sz>0 );
    if( SQLITE_WITHIN(pCell,aData,pEnd) ){
      if( ((uptr)(pCell+sz))>(uptr)pEnd ) return SQLITE_CORRUPT_BKPT;
      pCell = &pTmp[pCell - aData];
    }else if( (uptr)(pCell+sz)>(uptr)pSrcEnd
           && (uptr)(pCell)<(uptr)pSrcEnd
    ){
      return SQLITE_CORRUPT_BKPT;
    }

    pData -= sz;
    put2byte(pCellptr, (pData - aData));
    pCellptr += 2;
    if( pData < pCellptr ) return SQLITE_CORRUPT_BKPT;
    memcpy(pData, pCell, sz);
    assert( sz==pPg->xCellSize(pPg, pCell) || CORRUPT_DB );
    testcase( sz!=pPg->xCellSize(pPg,pCell) );
    i++;
    if( i>=iEnd ) break;
    if( pCArray->ixNx[k]<=i ){
      k++;
      pSrcEnd = pCArray->apEnd[k];
    }
  }

  /* The pPg->nFree field is now set incorrectly. The caller will fix it. */
  pPg->nCell = nCell;
  pPg->nOverflow = 0;

  put2byte(&aData[hdr+1], 0);
  put2byte(&aData[hdr+3], pPg->nCell);
  put2byte(&aData[hdr+5], pData - aData);
  aData[hdr+7] = 0x00;
  return SQLITE_OK;
}